

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O0

HPDF_STATUS HPDF_Stream_WriteToStreamWithDeflate(HPDF_Stream src,HPDF_Stream dst,HPDF_Encrypt e)

{
  bool bVar1;
  HPDF_UINT HVar2;
  int iVar3;
  HPDF_STATUS HVar4;
  undefined1 local_3418 [8];
  HPDF_BYTE ebuf [4518];
  Bytef otbuf [4518];
  HPDF_UINT local_10b8;
  HPDF_UINT osize;
  HPDF_UINT size;
  HPDF_BYTE local_10a8 [8];
  Bytef inbuf [4096];
  z_stream strm;
  HPDF_BOOL flg;
  HPDF_STATUS ret;
  HPDF_Encrypt e_local;
  HPDF_Stream dst_local;
  HPDF_Stream src_local;
  
  _size = local_3418;
  src_local = (HPDF_Stream)HPDF_Stream_Seek(src,0,HPDF_SEEK_SET);
  if (src_local == (HPDF_Stream)0x0) {
    HPDF_MemSet(inbuf + 0xff8,'\0',0x70);
    iVar3 = deflateInit_(inbuf + 0xff8,0xffffffff,"1.2.11",0x70);
    if ((long)iVar3 == 0) {
      inbuf._4088_8_ = local_10a8;
      bVar1 = false;
      do {
        local_10b8 = 0x1000;
        HVar4 = HPDF_Stream_Read(src,local_10a8,&local_10b8);
        HVar2 = local_10b8;
        inbuf._4088_8_ = local_10a8;
        if (HVar4 != 0) {
          if (HVar4 != 0x1058) {
            deflateEnd(inbuf + 0xff8);
            return HVar4;
          }
          bVar1 = true;
          if (local_10b8 == 0) break;
        }
        while (HVar2 != 0) {
          iVar3 = deflate(inbuf + 0xff8,0);
          HVar4 = (HPDF_STATUS)iVar3;
          if ((HVar4 != 0) && (HVar4 != 1)) {
            deflateEnd(inbuf + 0xff8);
            HVar4 = HPDF_SetError(src->error,0x1066,HVar4);
            return HVar4;
          }
        }
      } while (!bVar1);
      bVar1 = false;
      do {
        iVar3 = deflate(inbuf + 0xff8,4);
        HVar4 = (HPDF_STATUS)iVar3;
        if ((HVar4 != 0) && (HVar4 != 1)) {
          deflateEnd(inbuf + 0xff8);
          HVar4 = HPDF_SetError(src->error,0x1066,HVar4);
          return HVar4;
        }
        if (HVar4 == 1) {
          bVar1 = true;
        }
      } while (!bVar1);
      deflateEnd(inbuf + 0xff8);
      src_local = (HPDF_Stream)0x0;
    }
    else {
      src_local = (HPDF_Stream)HPDF_SetError(src->error,0x1066,(long)iVar3);
    }
  }
  return (HPDF_STATUS)src_local;
}

Assistant:

HPDF_STATUS
HPDF_Stream_WriteToStreamWithDeflate  (HPDF_Stream  src,
                                       HPDF_Stream  dst,
                                       HPDF_Encrypt  e)
{
#ifdef LIBHPDF_HAVE_ZLIB

#define DEFLATE_BUF_SIZ  ((HPDF_INT)(HPDF_STREAM_BUF_SIZ * 1.1) + 13)

    HPDF_STATUS ret;
    HPDF_BOOL flg;

    z_stream strm;
    Bytef inbuf[HPDF_STREAM_BUF_SIZ];
    Bytef otbuf[DEFLATE_BUF_SIZ];
    HPDF_BYTE ebuf[DEFLATE_BUF_SIZ];

    HPDF_PTRACE((" HPDF_Stream_WriteToStreamWithDeflate\n"));

    /* initialize input stream */
    ret = HPDF_Stream_Seek (src, 0, HPDF_SEEK_SET);
    if (ret != HPDF_OK)
        return ret;

    /* initialize decompression stream. */
    HPDF_MemSet(&strm, 0x00, sizeof(z_stream));
    strm.next_out = otbuf;
    strm.avail_out = DEFLATE_BUF_SIZ;

    ret = deflateInit_(&strm, Z_DEFAULT_COMPRESSION, ZLIB_VERSION,
            sizeof(z_stream));
    if (ret != Z_OK)
        return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);

    strm.next_in = inbuf;
    strm.avail_in = 0;

    flg = HPDF_FALSE;
    for (;;) {
        HPDF_UINT size = HPDF_STREAM_BUF_SIZ;

        ret = HPDF_Stream_Read (src, inbuf, &size);

        strm.next_in = inbuf;
        strm.avail_in = size;

        if (ret != HPDF_OK) {
            if (ret == HPDF_STREAM_EOF) {
                flg = HPDF_TRUE;
                if (size == 0)
                    break;
            } else {
                deflateEnd(&strm);
                return ret;
            }
        }

        while (strm.avail_in > 0) {
            ret = deflate(&strm, Z_NO_FLUSH);
            if (ret != Z_OK && ret != Z_STREAM_END) {
                deflateEnd(&strm);
                return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
            }

            if (strm.avail_out == 0) {
                if (e) {
                    HPDF_Encrypt_CryptBuf (e, otbuf, ebuf, DEFLATE_BUF_SIZ);
                    ret = HPDF_Stream_Write(dst, ebuf, DEFLATE_BUF_SIZ);
                } else
                    ret = HPDF_Stream_Write (dst, otbuf, DEFLATE_BUF_SIZ);

                if (ret != HPDF_OK) {
                    deflateEnd(&strm);
                    return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
                }

                strm.next_out = otbuf;
                strm.avail_out = DEFLATE_BUF_SIZ;
            }
        }

        if (flg)
            break;
    }

    flg = HPDF_FALSE;
    for (;;) {
        ret = deflate(&strm, Z_FINISH);
        if (ret != Z_OK && ret != Z_STREAM_END) {
            deflateEnd(&strm);
            return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
        }

        if (ret == Z_STREAM_END)
            flg = HPDF_TRUE;

        if (strm.avail_out < DEFLATE_BUF_SIZ) {
            HPDF_UINT osize = DEFLATE_BUF_SIZ - strm.avail_out;
            if (e) {
                HPDF_Encrypt_CryptBuf (e, otbuf, ebuf, osize);
                ret = HPDF_Stream_Write(dst, ebuf, osize);
            } else
                ret = HPDF_Stream_Write (dst, otbuf, osize);

            if (ret != HPDF_OK) {
                deflateEnd(&strm);
                return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
            }

            strm.next_out = otbuf;
            strm.avail_out = DEFLATE_BUF_SIZ;
        }

        if (flg)
            break;
    }

    deflateEnd(&strm);
    return HPDF_OK;
#else /* LIBHPDF_HAVE_ZLIB */
    HPDF_UNUSED (e);
    HPDF_UNUSED (dst);
    HPDF_UNUSED (src);
    return HPDF_UNSUPPORTED_FUNC;
#endif /* LIBHPDF_HAVE_ZLIB */
}